

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O1

Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *
wasm::WATParser::anon_unknown_11::inlineExports
          (Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *__return_storage_ptr__,
          ParseInput *in)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  _Alloc_hider _Var4;
  string_view expected;
  undefined1 auStack_c0 [8];
  optional<wasm::Name> name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  string local_88;
  Err local_68;
  void *pvStack_48;
  vector<wasm::Name,_std::allocator<wasm::Name>_> exports;
  
  pvStack_48 = (void *)0x0;
  exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    expected._M_str = "export";
    expected._M_len = 6;
    bVar3 = ParseInput::takeSExprStart(in,expected);
    if (!bVar3) {
      *(void **)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                 .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> =
           pvStack_48;
      *(pointer *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
               .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> + 8) =
           exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
               .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> + 0x10) =
           exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pvStack_48 = (void *)0x0;
      exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
               .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> + 0x20) =
           '\0';
LAB_00a019ba:
      if (pvStack_48 != (void *)0x0) {
        operator_delete(pvStack_48,
                        (long)exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pvStack_48);
      }
      return __return_storage_ptr__;
    }
    ParseInput::takeName((optional<wasm::Name> *)auStack_c0,in);
    if (name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\0') {
      name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Name>._16_8_ = &local_98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_engaged,"expected export name","");
      ParseInput::err(&local_68,in,
                      (string *)
                      &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_engaged);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                       .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                       super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> +
               0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).
        super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
        .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
        super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
        super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
        super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> = puVar1;
      paVar2 = &local_68.msg.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.msg._M_dataplus._M_p == paVar2) {
        *puVar1 = CONCAT71(local_68.msg.field_2._M_allocated_capacity._1_7_,
                           local_68.msg.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                 .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> + 0x18)
             = local_68.msg.field_2._8_8_;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->val).
          super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
          .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
          super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
          super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
          super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> =
             local_68.msg._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                          .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                          super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                          super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                          super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                          super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>
                  + 0x10) =
             CONCAT71(local_68.msg.field_2._M_allocated_capacity._1_7_,
                      local_68.msg.field_2._M_local_buf[0]);
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
               .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> + 8) =
           local_68.msg._M_string_length;
      local_68.msg._M_string_length = 0;
      local_68.msg.field_2._M_local_buf[0] = '\0';
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
               .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> + 0x20) =
           '\x01';
      _Var4._M_p = (pointer)name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::Name>._16_8_;
      local_68.msg._M_dataplus._M_p = (pointer)paVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._16_8_ != &local_98) {
LAB_00a019b2:
        local_68.msg._M_dataplus._M_p = (pointer)&local_68.msg.field_2;
        local_68.msg.field_2._M_local_buf[0] = '\0';
        local_68.msg._M_string_length = 0;
        operator_delete(_Var4._M_p,local_98._M_allocated_capacity + 1);
      }
      goto LAB_00a019ba;
    }
    bVar3 = ParseInput::takeRParen(in);
    if (!bVar3) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"expected end of import","");
      ParseInput::err(&local_68,in,&local_88);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                       .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                       super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> +
               0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).
        super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
        .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
        super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
        super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
        super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> = puVar1;
      paVar2 = &local_68.msg.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.msg._M_dataplus._M_p == paVar2) {
        *puVar1 = CONCAT71(local_68.msg.field_2._M_allocated_capacity._1_7_,
                           local_68.msg.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                 .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> + 0x18)
             = local_68.msg.field_2._8_8_;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->val).
          super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
          .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
          super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
          super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
          super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> =
             local_68.msg._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                          .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                          super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                          super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                          super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                          super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>
                  + 0x10) =
             CONCAT71(local_68.msg.field_2._M_allocated_capacity._1_7_,
                      local_68.msg.field_2._M_local_buf[0]);
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
               .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> + 8) =
           local_68.msg._M_string_length;
      local_68.msg._M_string_length = 0;
      local_68.msg.field_2._M_local_buf[0] = '\0';
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
               .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> + 0x20) =
           '\x01';
      local_98._M_allocated_capacity = local_88.field_2._M_allocated_capacity;
      _Var4._M_p = local_88._M_dataplus._M_p;
      local_68.msg._M_dataplus._M_p = (pointer)paVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) goto LAB_00a019b2;
      goto LAB_00a019ba;
    }
    if (exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_start ==
        exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                ((vector<wasm::Name,std::allocator<wasm::Name>> *)&pvStack_48,
                 (iterator)
                 exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                 super__Vector_impl_data._M_start,(Name *)auStack_c0);
    }
    else {
      ((exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_start)->super_IString).str._M_len = (size_t)auStack_c0;
      ((exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_start)->super_IString).str._M_str =
           (char *)name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                   _M_len;
      exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start =
           exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
  } while( true );
}

Assistant:

Result<std::vector<Name>> inlineExports(ParseInput& in) {
  std::vector<Name> exports;
  while (in.takeSExprStart("export"sv)) {
    auto name = in.takeName();
    if (!name) {
      return in.err("expected export name");
    }
    if (!in.takeRParen()) {
      return in.err("expected end of import");
    }
    exports.push_back(*name);
  }
  return exports;
}